

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_fits.c
# Opt level: O1

char * sfts_read_keystring0(sfts_t *f,char *key)

{
  int iVar1;
  anon_union_8_4_d826882f_for_v aVar2;
  sfkey_t k;
  sfkey_t local_48;
  
  local_48.v.f = 0.0;
  local_48.c = (char *)0x0;
  local_48.k = (char *)0x0;
  local_48.t = '\0';
  local_48._9_7_ = 0;
  aVar2.f = (double)g_malloc0(0x51);
  local_48.t = 'S';
  local_48.k = key;
  local_48.v.f = aVar2.f;
  iVar1 = sfts_read_keymaybe(f,&local_48);
  if (iVar1 != 1) {
    g_free(aVar2.f);
    aVar2.f = 0.0;
  }
  return (char *)aVar2.f;
}

Assistant:

char *sfts_read_keystring0(sfts_t *f, const char *key) {
    sfkey_t k = {.c = NULL };
    char *ret = (char *) g_malloc0(SKEY_LEN);
    k.k = key, k.t = 'S', k.v.s = ret;
    if (sfts_read_keymaybe(f, &k) != 1) {
        g_free(ret);
        ret = NULL;
    }

    return ret;
}